

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::ContentEncoding::ParseContentEncAESSettingsEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncAESSettings *aes)

{
  bool bVar1;
  long lVar2;
  unsigned_long_long uVar3;
  long unaff_RBX;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_50;
  longlong local_48;
  ContentEncAESSettings *local_40;
  long local_38;
  
  stop = size + start;
  local_50 = start;
  local_40 = aes;
  do {
    if (stop <= local_50) {
      return 0;
    }
    lVar2 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_48);
    if (lVar2 < 0) {
      bVar1 = false;
      unaff_RBX = lVar2;
    }
    else {
      if (local_38 == 0x47e8) {
        uVar3 = UnserializeUInt(pReader,local_50,local_48);
        local_40->cipher_mode = uVar3;
        if (uVar3 != 1) {
          bVar1 = false;
          unaff_RBX = -2;
          goto LAB_00161980;
        }
      }
      local_50 = local_50 + local_48;
      bVar1 = local_50 <= stop;
      if (stop < local_50) {
        unaff_RBX = -2;
      }
    }
LAB_00161980:
    if (!bVar1) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncAESSettingsEntry(
    long long start, long long size, IMkvReader* pReader,
    ContentEncAESSettings* aes) {
  assert(pReader);
  assert(aes);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvAESSettingsCipherMode) {
      aes->cipher_mode = UnserializeUInt(pReader, pos, size);
      if (aes->cipher_mode != 1)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}